

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# literal.cpp
# Opt level: O2

double __thiscall wasm::Literal::sqrt(Literal *this,double __x)

{
  BasicType BVar1;
  Literal *in_RSI;
  float fVar2;
  undefined4 extraout_XMM0_Db;
  double dVar3;
  undefined4 extraout_XMM0_Db_00;
  uintptr_t uStack_20;
  
  BVar1 = wasm::Type::getBasic(&in_RSI->type);
  if (BVar1 == f64) {
    dVar3 = getf64(in_RSI);
    if (dVar3 < 0.0) {
      dVar3 = ::sqrt(dVar3);
    }
    else {
      dVar3 = SQRT(dVar3);
    }
    *(double *)&this->field_0 = dVar3;
    uStack_20 = 5;
  }
  else {
    if (BVar1 != f32) {
      handle_unreachable("unexpected type",
                         "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm/literal.cpp"
                         ,0x428);
    }
    fVar2 = getf32(in_RSI);
    if (fVar2 < 0.0) {
      fVar2 = sqrtf(fVar2);
      dVar3 = (double)CONCAT44(extraout_XMM0_Db_00,fVar2);
    }
    else {
      dVar3 = (double)CONCAT44(extraout_XMM0_Db,SQRT(fVar2));
    }
    (this->field_0).i32 = SUB84(dVar3,0);
    uStack_20 = 4;
  }
  (this->type).id = uStack_20;
  return dVar3;
}

Assistant:

Literal Literal::sqrt() const {
  switch (type.getBasic()) {
    case Type::f32:
      return Literal(std::sqrt(getf32()));
    case Type::f64:
      return Literal(std::sqrt(getf64()));
    default:
      WASM_UNREACHABLE("unexpected type");
  }
}